

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cpp
# Opt level: O2

void __thiscall BaseNode::RenderSlot(BaseNode *this,char *slot_title,int kind)

{
  undefined8 *puVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  bool bVar6;
  ImU32 col;
  ImGuiID id;
  ImGuiStyle *pIVar7;
  ImDrawList *this_00;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float local_b8;
  float fStack_b4;
  float local_a8;
  float fStack_a4;
  ImVec2 local_80;
  ImColor color;
  ImRect circle_rect;
  
  pIVar7 = ImGui::GetStyle();
  fVar9 = gCanvas->zoom;
  IVar3 = ImGui::CalcTextSize(slot_title,(char *)0x0,false,-1.0);
  fVar12 = (pIVar7->ItemSpacing).x * gCanvas->zoom;
  if (kind < 1) {
    fVar12 = -fVar12;
  }
  IVar4 = ImGui::GetCursorScreenPos();
  color.Value.y = IVar4.y + 0.0;
  color.Value.x = fVar12 + IVar4.x;
  ImGui::SetCursorScreenPos((ImVec2 *)&color);
  bVar6 = ImNodes::BeginSlot(slot_title,kind);
  if (bVar6) {
    this_00 = ImGui::GetWindowDrawList();
    bVar6 = ImNodes::IsSlotCurveHovered();
    if (bVar6) {
      uVar8 = 5;
    }
    else {
      bVar6 = ImNodes::IsConnectingCompatibleSlot();
      if (bVar6) {
        bVar6 = IsAlreadyConnectedWithPendingConnection(this,slot_title,kind);
        uVar8 = bVar6 ^ 5;
      }
      else {
        uVar8 = 4;
      }
    }
    fVar9 = fVar9 * 5.0;
    puVar1 = (undefined8 *)((long)&gCanvas->colors[0].Value.x + (ulong)(uVar8 << 4));
    color.Value._0_8_ = *puVar1;
    color.Value._8_8_ = puVar1[1];
    ImGui::PushStyleColor(0,&color.Value);
    if (0 < kind) {
      local_a8 = IVar3.x;
      uVar8 = -(uint)(local_a8 <= this->output_max_title_width);
      fVar13 = (float)(~uVar8 & (uint)local_a8 | (uint)this->output_max_title_width & uVar8);
      this->output_max_title_width = fVar13;
      fVar11 = (pIVar7->ItemSpacing).x;
      fVar10 = ImGui::GetCursorPosX();
      ImGui::SetCursorPosX(fVar10 + ((fVar13 + fVar11) - local_a8));
      ImGui::TextUnformatted(slot_title,(char *)0x0);
      ImGui::SameLine(0.0,-1.0);
    }
    IVar4 = ImGui::GetCursorScreenPos();
    IVar5 = ImGui::GetCursorScreenPos();
    fVar13 = fVar9 + fVar9 + IVar5.x;
    local_b8 = IVar4.x;
    fStack_b4 = IVar4.y;
    circle_rect.Min.x = local_b8;
    fStack_a4 = IVar3.y;
    fVar11 = fStack_a4 * 0.5 - fVar9;
    fStack_b4 = fStack_b4 + fVar11;
    fVar11 = fVar9 + fVar9 + IVar5.y + fVar11;
    local_80.y = (fVar11 + fStack_b4) * 0.5;
    local_80.x = (fVar13 + local_b8) * 0.5;
    circle_rect.Min.y = fStack_b4;
    circle_rect.Max.x = fVar13;
    circle_rect.Max.y = fVar11;
    col = ImGui::ColorConvertFloat4ToU32(&color.Value);
    ImDrawList::AddCircleFilled(this_00,&local_80,fVar9,col,0xc);
    local_80.y = fVar11 - fStack_b4;
    local_80.x = fVar13 - local_b8;
    ImGui::ItemSize(&local_80,0.0);
    id = ImGui::GetID(this->title);
    ImGui::ItemAdd(&circle_rect,id,(ImRect *)0x0);
    if (kind < 0) {
      ImGui::SameLine(0.0,-1.0);
      ImGui::TextUnformatted(slot_title,(char *)0x0);
    }
    ImGui::PopStyleColor(1);
    ImNodes::EndSlot();
    pIVar2 = GImGui->CurrentWindow;
    pIVar2->WriteAccessed = true;
    (pIVar2->DC).CursorMaxPos.x = (pIVar2->DC).CursorMaxPos.x - fVar12;
  }
  return;
}

Assistant:

void RenderSlot(const char* slot_title, int kind)
    {
        const auto& style = ImGui::GetStyle();
        const float CIRCLE_RADIUS = 5.f * gCanvas->zoom;
        ImVec2 title_size = ImGui::CalcTextSize(slot_title);
        // Pull entire slot a little bit out of the edge so that curves connect into int without visible seams
        float item_offset_x = style.ItemSpacing.x * gCanvas->zoom;
        if (!ImNodes::IsOutputSlotKind(kind))
            item_offset_x = -item_offset_x;
        ImGui::SetCursorScreenPos(ImGui::GetCursorScreenPos() + ImVec2{item_offset_x, 0});

        if (ImNodes::BeginSlot(slot_title, kind))
        {
            auto* draw_lists = ImGui::GetWindowDrawList();

            // Slot appearance can be altered depending on curve hovering state.
            bool is_active = ImNodes::IsSlotCurveHovered() ||
                (ImNodes::IsConnectingCompatibleSlot() && !IsAlreadyConnectedWithPendingConnection(slot_title, kind));

            ImColor color = gCanvas->colors[is_active ? ImNodes::ColConnectionActive : ImNodes::ColConnection];

            ImGui::PushStyleColor(ImGuiCol_Text, color.Value);

            if (ImNodes::IsOutputSlotKind(kind))
            {
                // Align output slots to the right edge of the node.
                output_max_title_width = ImMax(output_max_title_width, title_size.x);
                float offset = (output_max_title_width + style.ItemSpacing.x) - title_size.x;
                ImGui::SetCursorPosX(ImGui::GetCursorPosX() + offset);

                ImGui::TextUnformatted(slot_title);
                ImGui::SameLine();
            }

            ImRect circle_rect{
                ImGui::GetCursorScreenPos(),
                ImGui::GetCursorScreenPos() + ImVec2{CIRCLE_RADIUS * 2, CIRCLE_RADIUS * 2}
            };
            // Vertical-align circle in the middle of the line.
            float circle_offset_y = title_size.y / 2.f - CIRCLE_RADIUS;
            circle_rect.Min.y += circle_offset_y;
            circle_rect.Max.y += circle_offset_y;
            draw_lists->AddCircleFilled(circle_rect.GetCenter(), CIRCLE_RADIUS, color);

            ImGui::ItemSize(circle_rect.GetSize());
            ImGui::ItemAdd(circle_rect, ImGui::GetID(title));

            if (ImNodes::IsInputSlotKind(kind))
            {
                ImGui::SameLine();
                ImGui::TextUnformatted(slot_title);
            }

            ImGui::PopStyleColor();
            ImNodes::EndSlot();

            // A dirty trick to place output slot circle on the border.
            ImGui::GetCurrentWindow()->DC.CursorMaxPos.x -= item_offset_x;
        }
    }